

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O2

entry_iterator * __thiscall Pathie::entry_iterator::operator++(entry_iterator *this,int param_1)

{
  dirent *pdVar1;
  range_error *this_00;
  undefined4 in_register_00000034;
  allocator local_59;
  string local_58;
  string local_38;
  
  if ((DIR *)this->mp_cur != (DIR *)0x0) {
    pdVar1 = readdir((DIR *)this->mp_cur);
    if (pdVar1 == (dirent *)0x0) {
      close_native_handle(this);
    }
    else {
      std::__cxx11::string::string((string *)&local_38,pdVar1->d_name,&local_59);
      filename_to_utf8(&local_58,&local_38);
      Path::operator=(this->mp_cur_path,&local_58);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    return this;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,param_1));
  std::__cxx11::string::string
            ((string *)&local_58,"Tried to advance a finished entry_iterator!",
             (allocator *)&local_38);
  std::range_error::range_error(this_00,(string *)&local_58);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

entry_iterator& entry_iterator::operator++(int)
{
  if (mp_cur) {
#if defined(_PATHIE_UNIX)
    struct dirent* p_dirent = readdir(static_cast<DIR*>(mp_cur));
    if (p_dirent) {
      *mp_cur_path = filename_to_utf8(p_dirent->d_name);
    }
    else {
      close_native_handle();
    }
#elif defined(_WIN32)
    WIN32_FIND_DATAW finddata;
    if (FindNextFileW(static_cast<HANDLE>(mp_cur), &finddata)) {
      *mp_cur_path = utf16_to_utf8(finddata.cFileName);
    }
    else {
      close_native_handle();
    }
#else
#error Unsupported system
#endif
  }
  else { // Finished already
    throw(std::range_error("Tried to advance a finished entry_iterator!"));
  }

  return *this;
}